

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O3

dtl_dv_t * dtl_json_load_bstr(uint8_t *pBegin,uint8_t *pEnd)

{
  uint8_t *puVar1;
  dtl_dv_t *pdVar2;
  dtl_json_reader_t reader;
  dtl_json_reader_t local_80;
  
  dtl_json_reader_create(&local_80);
  local_80.eof = true;
  puVar1 = dtl_json_reader_parse_block(&local_80,pBegin,pEnd);
  if (puVar1 == pEnd) {
    pdVar2 = (local_80.data)->currentElem;
    if (pdVar2 != (dtl_dv_t *)0x0) {
      dtl_dv_inc_ref(pdVar2);
    }
  }
  else {
    pdVar2 = (dtl_dv_t *)0x0;
  }
  dtl_json_reader_destroy(&local_80);
  return pdVar2;
}

Assistant:

dtl_dv_t* dtl_json_load_bstr(const uint8_t *pBegin, const uint8_t *pEnd)
{
   dtl_dv_t *retval = (dtl_dv_t*) 0;
   const uint8_t *pResult;
   dtl_json_reader_t reader;
   dtl_json_reader_create(&reader);
   reader.eof = true;
   pResult = dtl_json_reader_parse_block(&reader, pBegin, pEnd);
   if (pResult == (const uint8_t*) pEnd)
   {
      if (reader.data->currentElem != 0)
      {
         retval = reader.data->currentElem;
         dtl_dv_inc_ref(reader.data->currentElem);
      }
      dtl_json_reader_destroy(&reader);
   }
   else
   {
      dtl_json_reader_destroy(&reader);
   }
   return retval;
}